

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall test_rope::build_graph(test_rope *this,ggml_context *ctx)

{
  value_type_conflict3 vVar1;
  value_type_conflict3 vVar2;
  value_type_conflict3 vVar3;
  ggml_tensor *pgVar4;
  undefined8 uVar5;
  reference pvVar6;
  const_reference pvVar7;
  undefined8 in_RSI;
  long in_RDI;
  int rope_sections_1 [4];
  int rope_sections [4];
  ggml_tensor *out;
  ggml_tensor *freq;
  ggml_tensor *pos;
  bool is_vision;
  bool is_mrope;
  array<long,_4UL> ne;
  ggml_tensor *a;
  size_t in_stack_fffffffffffffee8;
  uint uVar8;
  array<long,_4UL> *in_stack_fffffffffffffef0;
  uint uVar9;
  int64_t *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  ggml_type type;
  ggml_context *in_stack_ffffffffffffff08;
  test_case *in_stack_ffffffffffffff10;
  int local_88;
  int local_84;
  int local_80;
  undefined4 local_7c;
  int local_78;
  int local_74;
  undefined4 local_70;
  undefined4 local_6c;
  ggml_tensor *local_60;
  ggml_tensor *local_58;
  ggml_tensor *local_50;
  byte local_42;
  byte local_41;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  ggml_tensor *local_20;
  undefined8 local_18;
  
  local_18 = in_RSI;
  if ((*(uint *)(in_RDI + 0x7c) & 1) == 0) {
    std::array<long,_4UL>::data((array<long,_4UL> *)0x15ec50);
    local_20 = test_case::ggml_new_tensor
                         (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                          (ggml_type)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                          (int)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    type = (ggml_type)((ulong)in_stack_ffffffffffffff00 >> 0x20);
    if ((*(byte *)(in_RDI + 0x80) & 1) != 0) {
      ggml_set_param(local_18,local_20);
    }
    ggml_set_name(local_20,"a");
  }
  else {
    local_40 = *(undefined8 *)(in_RDI + 0x40);
    local_38 = *(undefined8 *)(in_RDI + 0x48);
    local_30 = *(undefined8 *)(in_RDI + 0x50);
    local_28 = *(undefined8 *)(in_RDI + 0x58);
    pvVar6 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    *pvVar6 = *pvVar6 << 1;
    pvVar6 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    *pvVar6 = *pvVar6 << 2;
    pvVar6 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    *pvVar6 = *pvVar6 * 3;
    std::array<long,_4UL>::data((array<long,_4UL> *)0x15eabd);
    local_20 = test_case::ggml_new_tensor
                         (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                          (ggml_type)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                          (int)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    if ((*(byte *)(in_RDI + 0x80) & 1) != 0) {
      ggml_set_param(local_18,local_20);
    }
    ggml_set_name(local_20,"a");
    uVar5 = local_18;
    pgVar4 = local_20;
    pvVar7 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    vVar1 = *pvVar7;
    pvVar7 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    vVar2 = *pvVar7;
    pvVar7 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    vVar3 = *pvVar7;
    pvVar7 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    in_stack_fffffffffffffee8 = local_20->nb[1];
    in_stack_fffffffffffffef0 = (array<long,_4UL> *)local_20->nb[2];
    in_stack_fffffffffffffef8 = (int64_t *)local_20->nb[3];
    type = GGML_TYPE_F32;
    local_20 = (ggml_tensor *)ggml_view_4d(uVar5,pgVar4,vVar1,vVar2,vVar3,*pvVar7);
    ggml_set_name(local_20,"view_of_a");
  }
  local_41 = (*(uint *)(in_RDI + 100) & 8) != 0;
  local_42 = *(int *)(in_RDI + 100) == 0x18;
  if (((bool)local_41) || ((bool)local_42)) {
    std::array<long,_4UL>::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    uVar9 = (uint)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    uVar8 = (uint)(in_stack_fffffffffffffee8 >> 0x20);
    local_50 = test_case::ggml_new_tensor_1d
                         (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,type,
                          (int64_t)in_stack_fffffffffffffef8);
  }
  else {
    std::array<long,_4UL>::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    uVar9 = (uint)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    uVar8 = (uint)(in_stack_fffffffffffffee8 >> 0x20);
    local_50 = test_case::ggml_new_tensor_1d
                         (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,type,
                          (int64_t)in_stack_fffffffffffffef8);
  }
  ggml_set_name(local_50,"pos");
  local_58 = (ggml_tensor *)0x0;
  if ((*(byte *)(in_RDI + 0x78) & 1) != 0) {
    local_58 = test_case::ggml_new_tensor_1d
                         (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,type,
                          (int64_t)in_stack_fffffffffffffef8);
    ggml_set_name(local_58,"freq");
  }
  if ((local_41 & 1) == 0) {
    if ((*(byte *)(in_RDI + 0x80) & 1) == 0) {
      local_60 = (ggml_tensor *)
                 ggml_rope_ext_back(0x461c4000,*(undefined4 *)(in_RDI + 0x6c),
                                    *(undefined4 *)(in_RDI + 0x70),*(undefined4 *)(in_RDI + 0x74),
                                    0x3f800000,local_18,local_20,local_50,local_58,
                                    *(undefined4 *)(in_RDI + 0x60),*(undefined4 *)(in_RDI + 100),
                                    (ulong)uVar8 << 0x20);
    }
    else {
      local_60 = (ggml_tensor *)
                 ggml_rope_ext(0x461c4000,*(undefined4 *)(in_RDI + 0x6c),
                               *(undefined4 *)(in_RDI + 0x70),*(undefined4 *)(in_RDI + 0x74),
                               0x3f800000,local_18,local_20,local_50,local_58,
                               *(undefined4 *)(in_RDI + 0x60),*(undefined4 *)(in_RDI + 100),
                               (ulong)uVar8 << 0x20);
    }
  }
  else if ((local_42 & 1) == 0) {
    if (*(int *)(in_RDI + 0x60) / 3 < 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                 ,0xa23,"GGML_ASSERT(%s) failed","n_dims/3 > 0");
    }
    local_88 = *(int *)(in_RDI + 0x60) / 3;
    local_84 = *(int *)(in_RDI + 0x60) / 3;
    local_80 = *(int *)(in_RDI + 0x60) / 3;
    local_7c = 0;
    if ((*(byte *)(in_RDI + 0x80) & 1) == 0) {
      local_60 = (ggml_tensor *)
                 ggml_rope_multi_back
                           (0x461c4000,*(undefined4 *)(in_RDI + 0x6c),*(undefined4 *)(in_RDI + 0x70)
                            ,*(undefined4 *)(in_RDI + 0x74),0x3f800000,local_18,local_20,local_50,
                            local_58,*(undefined4 *)(in_RDI + 0x60),&local_88,
                            CONCAT44(uVar8,*(undefined4 *)(in_RDI + 100)),(ulong)uVar9 << 0x20);
    }
    else {
      local_60 = (ggml_tensor *)
                 ggml_rope_multi(0x461c4000,*(undefined4 *)(in_RDI + 0x6c),
                                 *(undefined4 *)(in_RDI + 0x70),*(undefined4 *)(in_RDI + 0x74),
                                 0x3f800000,local_18,local_20,local_50,local_58,
                                 *(undefined4 *)(in_RDI + 0x60),&local_88,
                                 CONCAT44(uVar8,*(undefined4 *)(in_RDI + 100)),(ulong)uVar9 << 0x20)
      ;
    }
  }
  else {
    if (*(int *)(in_RDI + 0x60) / 4 < 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                 ,0xa1b,"GGML_ASSERT(%s) failed","n_dims/4 > 0");
    }
    local_78 = *(int *)(in_RDI + 0x60) / 4;
    local_74 = *(int *)(in_RDI + 0x60) / 4;
    local_70 = 0;
    local_6c = 0;
    if ((*(byte *)(in_RDI + 0x80) & 1) == 0) {
      local_60 = (ggml_tensor *)
                 ggml_rope_multi_back
                           (0x461c4000,*(undefined4 *)(in_RDI + 0x6c),*(undefined4 *)(in_RDI + 0x70)
                            ,*(undefined4 *)(in_RDI + 0x74),0x3f800000,local_18,local_20,local_50,
                            local_58,(long)*(int *)(in_RDI + 0x60) / 2 & 0xffffffff,&local_78,
                            CONCAT44(uVar8,*(undefined4 *)(in_RDI + 100)),(ulong)uVar9 << 0x20);
    }
    else {
      local_60 = (ggml_tensor *)
                 ggml_rope_multi(0x461c4000,*(undefined4 *)(in_RDI + 0x6c),
                                 *(undefined4 *)(in_RDI + 0x70),*(undefined4 *)(in_RDI + 0x74),
                                 0x3f800000,local_18,local_20,local_50,local_58,
                                 (long)*(int *)(in_RDI + 0x60) / 2 & 0xffffffff,&local_78,
                                 CONCAT44(uVar8,*(undefined4 *)(in_RDI + 100)),(ulong)uVar9 << 0x20)
      ;
    }
  }
  ggml_set_name(local_60,"out");
  return local_60;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a;
        if (v & 1) {
            auto ne = ne_a; ne[0] *= 2; ne[1] *= 4; ne[2] *= 3;
            a = ggml_new_tensor(ctx, type, 4, ne.data());
            if (forward) {
                ggml_set_param(ctx, a);
            }
            ggml_set_name(a, "a");

            a = ggml_view_4d(ctx, a, ne_a[0], ne_a[1], ne_a[2], ne_a[3], a->nb[1], a->nb[2], a->nb[3], 0);
            ggml_set_name(a, "view_of_a");
        } else {
            a = ggml_new_tensor(ctx, type, 4, ne_a.data());
            if (forward) {
                ggml_set_param(ctx, a);
            }
            ggml_set_name(a, "a");
        }

        const bool is_mrope = mode & GGML_ROPE_TYPE_MROPE;
        const bool is_vision = mode == GGML_ROPE_TYPE_VISION;

        ggml_tensor * pos;
        if (is_mrope || is_vision) {
            pos = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, ne_a[2] * 4);
        } else {
            pos = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, ne_a[2]);
        }
        ggml_set_name(pos, "pos");

        ggml_tensor * freq = nullptr;
        if (ff) {
            freq = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_dims/2);
            ggml_set_name(freq, "freq");
        }

        ggml_tensor * out;
        if (is_mrope) {
            if (is_vision) {
                GGML_ASSERT(n_dims/4 > 0);
                int rope_sections[4] = {n_dims/4, n_dims/4, 0, 0}; // Vision-RoPE only use first two dimension for image (x, y) coordinate
                if (forward) {
                    out = ggml_rope_multi     (ctx, a, pos, freq, n_dims/2, rope_sections, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
                } else {
                    out = ggml_rope_multi_back(ctx, a, pos, freq, n_dims/2, rope_sections, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
                }
            } else {
                GGML_ASSERT(n_dims/3 > 0);
                int rope_sections[4] = {n_dims/3, n_dims/3, n_dims/3, 0};
                if (forward) {
                    out = ggml_rope_multi     (ctx, a, pos, freq, n_dims, rope_sections, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
                } else {
                    out = ggml_rope_multi_back(ctx, a, pos, freq, n_dims, rope_sections, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
                }
            }
        } else {
            if (forward) {
                out = ggml_rope_ext     (ctx, a, pos, freq, n_dims, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
            } else {
                out = ggml_rope_ext_back(ctx, a, pos, freq, n_dims, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
            }
        }
        ggml_set_name(out, "out");

        return out;
    }